

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_12,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  int col;
  undefined4 uVar7;
  float afStack_a8 [6];
  float local_90 [4];
  float local_80 [2];
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  float fStack_5c;
  Vector<float,_3> res_1;
  float fStack_44;
  Matrix<float,_3,_4> retVal;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = retVal.m_data.m_data[0].m_data + 2;
    lVar2 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar2 != lVar6) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar6) = uVar7;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x30);
      lVar5 = lVar5 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0xc;
    } while (lVar5 != 3);
    retVal.m_data.m_data._8_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    retVal.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[0];
    retVal.m_data.m_data[1].m_data[1] = evalCtx->in[0].m_data[2];
    retVal.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    retVal.m_data.m_data._32_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    retVal.m_data.m_data[3].m_data[2] = evalCtx->in[3].m_data[0];
    retVal.m_data.m_data[3].m_data[1] = evalCtx->in[2].m_data[2];
  }
  else {
    pfVar1 = retVal.m_data.m_data[0].m_data + 2;
    retVal.m_data.m_data[3].m_data[1] = 0.0;
    retVal.m_data.m_data[3].m_data[2] = 0.0;
    retVal.m_data.m_data[2].m_data[0] = 0.0;
    retVal.m_data.m_data[2].m_data[1] = 0.0;
    retVal.m_data.m_data[2].m_data[2] = 0.0;
    retVal.m_data.m_data[3].m_data[0] = 0.0;
    retVal.m_data.m_data[0].m_data[2] = 0.0;
    retVal.m_data.m_data[1].m_data[0] = 0.0;
    retVal.m_data.m_data[1].m_data[1] = 0.0;
    retVal.m_data.m_data[1].m_data[2] = 0.0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat4x3;
    lVar2 = 0;
    do {
      lVar5 = 0;
      pfVar4 = pfVar1;
      do {
        *pfVar4 = (float)puVar3[lVar5];
        lVar5 = lVar5 + 1;
        pfVar4 = pfVar4 + 3;
      } while (lVar5 != 4);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 4;
    } while (lVar2 != 3);
  }
  pfVar1 = res.m_data;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  stack0xffffffffffffffb0 = 0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  stack0xffffffffffffffa0 = 0;
  lVar2 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar2 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)pfVar1 + lVar6) = uVar7;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    pfVar1 = pfVar1 + 1;
    lVar2 = lVar2 + 0xc;
  } while (lVar5 != 3);
  pfVar1 = res.m_data;
  pfVar4 = retVal.m_data.m_data[0].m_data + 2;
  lVar2 = 0;
  do {
    lVar5 = 0;
    do {
      *(uint *)((long)pfVar1 + lVar5) = *(uint *)((long)pfVar4 + lVar5) ^ 0x80000000;
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x30);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 1;
    pfVar4 = pfVar4 + 1;
  } while (lVar2 != 3);
  local_90[2] = 0.0;
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  lVar2 = 0;
  do {
    local_90[lVar2] = res.m_data[lVar2] + res_1.m_data[lVar2 + -1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  res_2.m_data._0_8_ = res_2.m_data._0_8_ & 0xffffffff00000000;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2 + -2] = local_90[lVar2] + res_1.m_data[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_a8[4] = 0.0;
  afStack_a8[2] = 0.0;
  afStack_a8[3] = 0.0;
  lVar2 = 0;
  do {
    afStack_a8[lVar2 + 2] = res_2.m_data[lVar2 + -2] + retVal.m_data.m_data[0].m_data[lVar2 + -1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 1.4013e-45;
  res_2.m_data[2] = 2.8026e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)res_2.m_data[lVar2 + -2]] = afStack_a8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}